

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnReturn(TypeChecker *this)

{
  bool bVar1;
  Result RVar2;
  Label *local_28;
  Label *func_label;
  TypeChecker *pTStack_18;
  Result result;
  TypeChecker *this_local;
  
  pTStack_18 = this;
  Result::Result((Result *)((long)&func_label + 4),Ok);
  RVar2 = GetThisFunctionLabel(this,&local_28);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = PopAndCheckSignature(this,&local_28->result_types,"return");
    Result::operator|=((Result *)((long)&func_label + 4),RVar2);
    RVar2 = SetUnreachable(this);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      this_local._4_4_ = func_label._4_4_;
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnReturn() {
  Result result = Result::Ok;
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= PopAndCheckSignature(func_label->result_types, "return");
  CHECK_RESULT(SetUnreachable());
  return result;
}